

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O1

bool __thiscall kj::_::expectExit(_ *this,Maybe<int> *statusCode,FunctionParam<void_()> code)

{
  __pid_t __pid;
  int iVar1;
  __pid_t _Var2;
  uint __sig;
  int *s;
  _ *p_Var3;
  bool bVar4;
  int status;
  DebugComparison<int,_int_&> _kjCondition;
  Fault f;
  undefined4 local_6c;
  undefined1 local_68 [24];
  size_t local_50;
  bool local_48;
  Fault local_38;
  NullableValue<int> *local_30;
  undefined8 local_28;
  
  local_28 = code.space._0_8_;
  local_30 = &statusCode->ptr;
  do {
    __pid = fork();
    if (-1 < __pid) {
      iVar1 = 0;
      break;
    }
    iVar1 = Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    if (__pid == 0) {
      (*(code *)*local_30)();
      _exit(0);
    }
    do {
      _Var2 = waitpid(__pid,&local_6c,0);
      if (-1 < _Var2) {
        iVar1 = 0;
        break;
      }
      iVar1 = Debug::getOsErrorNumber(false);
    } while (iVar1 == -1);
    if (iVar1 == 0) {
      __sig = local_6c & 0x7f;
      if (__sig == 0) {
        p_Var3 = (_ *)0x0;
        if (*this != (_)0x0) {
          p_Var3 = this + 4;
        }
        local_68._0_4_ = local_6c >> 8 & 0xff;
        if (*this == (_)0x1) {
          local_48 = local_68._0_4_ == *(uint *)p_Var3;
          local_68._0_8_ = CONCAT44(local_68._4_4_,local_6c >> 8) & 0xffffffff000000ff;
          local_68._16_8_ = " == ";
          local_50 = 5;
          if ((!local_48) && (Debug::minSeverity < 3)) {
            local_68._8_8_ = p_Var3;
            Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int&>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                       ,0x95,ERROR,
                       "\"failed: expected \" \"WEXITSTATUS(status) == s\", _kjCondition",
                       (char (*) [42])"failed: expected WEXITSTATUS(status) == s",
                       (DebugComparison<int,_int_&> *)local_68);
          }
          bVar4 = (local_6c >> 8 & 0xff) == *(uint *)p_Var3;
        }
        else {
          local_68._4_4_ = 0;
          local_68._8_8_ = " != ";
          local_68._16_8_ = &DAT_00000005;
          local_50 = CONCAT71(local_50._1_7_,local_68._0_4_ != 0);
          if ((local_68._0_4_ == 0) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                       ,0x98,ERROR,
                       "\"failed: expected \" \"WEXITSTATUS(status) != 0\", _kjCondition",
                       (char (*) [42])"failed: expected WEXITSTATUS(status) != 0",
                       (DebugComparison<int,_int> *)local_68);
          }
          bVar4 = local_6c._1_1_ != '\0';
        }
      }
      else {
        if ((int)(__sig * 0x1000000 + 0x1000000) < 0x2000000) {
          if (Debug::minSeverity < 3) {
            Debug::log<char_const(&)[51],int&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                       ,0x9f,ERROR,
                       "\"subprocess didn\'t exit and didn\'t trigger a signal\", status",
                       (char (*) [51])"subprocess didn\'t exit and didn\'t trigger a signal",
                       &local_6c);
          }
        }
        else if (Debug::minSeverity < 3) {
          local_68._0_8_ = strsignal(__sig);
          Debug::log<char_const(&)[46],char*>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                     ,0x9d,ERROR,
                     "\"subprocess didn\'t exit but triggered a signal\", strsignal(WTERMSIG(status))"
                     ,(char (*) [46])"subprocess didn\'t exit but triggered a signal",
                     (char **)local_68);
        }
        bVar4 = false;
      }
      return bVar4;
    }
    local_38.exception = (Exception *)0x0;
    local_68._0_8_ = (char *)0x0;
    local_68._8_8_ = (int *)0x0;
    Debug::Fault::init(&local_38,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                      );
  }
  else {
    local_38.exception = (Exception *)0x0;
    local_68._0_8_ = (char *)0x0;
    local_68._8_8_ = (int *)0x0;
    Debug::Fault::init(&local_38,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                      );
  }
  Debug::Fault::fatal(&local_38);
}

Assistant:

bool expectExit(Maybe<int> statusCode, FunctionParam<void()> code)  noexcept {
#if _WIN32
  // We don't support death tests on Windows due to lack of efficient fork.
  return true;
#else
  pid_t child;
  KJ_SYSCALL(child = fork());
  if (child == 0) {
    code();
    _exit(0);
  }

  int status;
  KJ_SYSCALL(waitpid(child, &status, 0));

  if (WIFEXITED(status)) {
    KJ_IF_SOME(s, statusCode) {
      KJ_EXPECT(WEXITSTATUS(status) == s);
      return WEXITSTATUS(status) == s;
    } else {
      KJ_EXPECT(WEXITSTATUS(status) != 0);
      return WEXITSTATUS(status) != 0;
    }
  } else {
    if (WIFSIGNALED(status)) {
      KJ_FAIL_EXPECT("subprocess didn't exit but triggered a signal", strsignal(WTERMSIG(status)));
    } else {
      KJ_FAIL_EXPECT("subprocess didn't exit and didn't trigger a signal", status);
    }
    return false;
  }
#endif
}